

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  xmlParserInputPtr pxVar8;
  uint uVar9;
  
  iVar2 = ctxt->nameNr;
  iVar3 = ctxt->spaceNr;
  iVar4 = ctxt->nodeNr;
  pxVar8 = ctxt->input;
  if ((pxVar8->flags & 0x40) != 0) goto LAB_0013b29d;
  do {
    if ((long)pxVar8->end - (long)pxVar8->cur < 0xfa) {
      xmlParserGrow(ctxt);
    }
LAB_0013b29d:
    do {
      pxVar5 = ctxt->input->cur;
      pxVar6 = ctxt->input->end;
      if (pxVar6 <= pxVar5) {
        iVar7 = ctxt->nameNr;
        if (iVar2 < iVar7) {
LAB_0013b3b8:
          if (ctxt->wellFormed != 0) {
            xmlFatalErrMsgStrIntStr
                      (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
                       ctxt->nameTab[(long)iVar7 + -1],ctxt->pushTab[(long)iVar7 + -1].line,
                       (xmlChar *)0x0);
          }
        }
        goto LAB_0013b3fb;
      }
      if (1 < ctxt->disableSAX) {
LAB_0013b395:
        iVar7 = ctxt->nameNr;
        if (iVar2 < iVar7 && pxVar6 <= pxVar5) goto LAB_0013b3b8;
LAB_0013b3fb:
        while (iVar4 < ctxt->nodeNr) {
          nodePop(ctxt);
        }
        while (iVar2 < ctxt->nameNr) {
          iVar4 = ctxt->pushTab[(long)ctxt->nameNr + -1].nsNr;
          if (iVar4 != 0) {
            xmlParserNsPop(ctxt,iVar4);
          }
          namePop(ctxt);
        }
        while (iVar3 < ctxt->spaceNr) {
          spacePop(ctxt);
        }
        return;
      }
      if (*pxVar5 == '&') {
        xmlParseReference(ctxt);
      }
      else if (*pxVar5 == '<') {
        xVar1 = pxVar5[1];
        if (xVar1 == '!') {
          if (((((pxVar5[2] == '[') && (pxVar5[3] == 'C')) && (pxVar5[4] == 'D')) &&
              ((pxVar5[5] == 'A' && (pxVar5[6] == 'T')))) &&
             ((pxVar5[7] == 'A' && (pxVar5[8] == '[')))) {
            xmlParseCDSect(ctxt);
          }
          else {
            if ((pxVar5[2] != '-') || (pxVar5[3] != '-')) goto LAB_0013b364;
            xmlParseComment(ctxt);
          }
        }
        else if (xVar1 == '/') {
          if (ctxt->nameNr <= iVar2) goto LAB_0013b395;
          xmlParseElementEnd(ctxt);
        }
        else if (xVar1 == '?') {
          xmlParsePI(ctxt);
        }
        else {
LAB_0013b364:
          xmlParseElementStart(ctxt);
        }
      }
      else {
        xmlParseCharDataInternal(ctxt,0);
      }
      pxVar8 = ctxt->input;
      uVar9 = pxVar8->flags;
      if ((uVar9 & 0x40) == 0) {
        xmlParserShrink(ctxt);
        pxVar8 = ctxt->input;
        uVar9 = pxVar8->flags;
      }
    } while ((uVar9 & 0x40) != 0);
  } while( true );
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int oldNameNr = ctxt->nameNr;
    int oldSpaceNr = ctxt->spaceNr;
    int oldNodeNr = ctxt->nodeNr;

    GROW;
    while ((ctxt->input->cur < ctxt->input->end) &&
	   (PARSER_STOPPED(ctxt) == 0)) {
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= oldNameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharDataInternal(ctxt, 0);
	}

	SHRINK;
	GROW;
    }

    if ((ctxt->nameNr > oldNameNr) &&
        (ctxt->input->cur >= ctxt->input->end) &&
        (ctxt->wellFormed)) {
        const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
        int line = ctxt->pushTab[ctxt->nameNr - 1].line;
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                "Premature end of data in tag %s line %d\n",
                name, line, NULL);
    }

    /*
     * Clean up in error case
     */

    while (ctxt->nodeNr > oldNodeNr)
        nodePop(ctxt);

    while (ctxt->nameNr > oldNameNr) {
        xmlStartTag *tag = &ctxt->pushTab[ctxt->nameNr - 1];

        if (tag->nsNr != 0)
            xmlParserNsPop(ctxt, tag->nsNr);

        namePop(ctxt);
    }

    while (ctxt->spaceNr > oldSpaceNr)
        spacePop(ctxt);
}